

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.cpp
# Opt level: O0

void __thiscall
haVoc::ScoredMoves::load_and_score
          (ScoredMoves *this,position *p,Movegen *moves,vector<Move,_std::allocator<Move>_> *filters
          ,Move *previous,Move *followup,Move *threat,node *stack,ScoreFunc *score_lambda)

{
  Score SVar1;
  bool bVar2;
  Score SVar3;
  Move *m_00;
  const_reference pvVar4;
  ScoredMove local_4c;
  Score local_44;
  Move local_3f;
  Score sc;
  Move m;
  Move *pMStack_38;
  int i;
  Move *followup_local;
  Move *previous_local;
  vector<Move,_std::allocator<Move>_> *filters_local;
  Movegen *moves_local;
  position *p_local;
  ScoredMoves *this_local;
  
  this->m_end = 0;
  this->m_start = 0;
  pMStack_38 = followup;
  for (sc = draw; SVar1 = sc, SVar3 = Movegen::size(moves), SVar1 < SVar3; sc = sc + 1) {
    m_00 = Movegen::operator[](moves,&sc);
    Move::Move(&local_3f,m_00);
    pvVar4 = std::vector<Move,_std::allocator<Move>_>::operator[](filters,0);
    bVar2 = Move::operator==(&local_3f,pvVar4);
    if (!bVar2) {
      pvVar4 = std::vector<Move,_std::allocator<Move>_>::operator[](filters,1);
      bVar2 = Move::operator==(&local_3f,pvVar4);
      if (!bVar2) {
        pvVar4 = std::vector<Move,_std::allocator<Move>_>::operator[](filters,2);
        bVar2 = Move::operator==(&local_3f,pvVar4);
        if (!bVar2) {
          pvVar4 = std::vector<Move,_std::allocator<Move>_>::operator[](filters,3);
          bVar2 = Move::operator==(&local_3f,pvVar4);
          if (!bVar2) {
            pvVar4 = std::vector<Move,_std::allocator<Move>_>::operator[](filters,4);
            bVar2 = Move::operator==(&local_3f,pvVar4);
            if (!bVar2) {
              local_44 = std::
                         function<Score_(const_position_&,_const_Move_&,_const_Move_&,_const_Move_&,_const_Move_&,_node_*)>
                         ::operator()(score_lambda,p,&local_3f,previous,pMStack_38,threat,stack);
              ScoredMove::ScoredMove(&local_4c,&local_3f,&local_44);
              std::vector<haVoc::ScoredMove,_std::allocator<haVoc::ScoredMove>_>::
              emplace_back<haVoc::ScoredMove>(&this->m_moves,&local_4c);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ScoredMoves::load_and_score(const position& p, Movegen* moves, const std::vector<Move>& filters, const Move& previous, const Move& followup, const Move& threat, node* stack, ScoreFunc score_lambda)
	{
		m_start = m_end = 0;
		for (int i = 0; i < moves->size(); ++i) {
			
			auto m = (*moves)[i];

			// skip hash moves and killers
			if (m == filters[0] || m == filters[1] || m == filters[2] ||
				m == filters[3] || m == filters[4])
				continue;

			Score sc = score_lambda(p, m, previous, followup, threat, stack);
			m_moves.emplace_back(ScoredMove(m, sc));
		}
	}